

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture3DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  int i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int z;
  bool bVar11;
  int lodOffsNdx;
  int y;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Texture3DView TVar24;
  Vector<bool,_4> res_6;
  Vec2 lodO;
  Vector<float,_4> res_4;
  Vector<float,_4> res_2;
  Vec2 lodBounds;
  IVec3 srcSize;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vector<float,_3> res_13;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodBias;
  Texture3DView src;
  Vec2 lodOffsets [4];
  float local_2a8;
  Vec2 local_2a0;
  float local_298;
  float local_290 [4];
  float local_280;
  float local_27c;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  int local_258;
  int local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [32];
  float local_208 [2];
  ulong local_200;
  int local_1f4 [3];
  ReferenceParams *local_1e8;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198 [4];
  Vec4 local_188;
  float local_178 [4];
  float local_168;
  float local_164;
  float local_158 [4];
  float local_148;
  float local_144;
  float local_138 [4];
  float local_128;
  float local_124;
  float local_118 [4];
  float local_108;
  float local_104;
  PixelBufferAccess *local_100;
  float local_f8 [4];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_e8;
  undefined1 local_c8 [16];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ConstPixelBufferAccess *local_a0;
  ConstPixelBufferAccess *local_98;
  Sampler *local_90;
  ulong local_88;
  float afStack_80 [2];
  Texture3DView local_78;
  undefined1 local_68 [4];
  float fStack_64;
  ConstPixelBufferAccess *pCStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  local_e8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = errorMask;
  local_98 = reference;
  TVar24 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  pCStack_60 = TVar24.m_levels;
  local_68 = (undefined1  [4])TVar24.m_numLevels;
  local_90 = &sampleParams->sampler;
  TVar24 = tcu::getEffectiveTextureView((Texture3DView *)local_68,&local_e8,local_90);
  local_78.m_levels = TVar24.m_levels;
  local_78.m_numLevels = TVar24.m_numLevels;
  local_1f4[1] = 0;
  local_1f4[0] = 0;
  if (0 < local_78.m_numLevels) {
    local_1f4[0] = ((local_78.m_levels)->m_size).m_data[0];
    local_1f4[1] = ((local_78.m_levels)->m_size).m_data[1];
  }
  local_118[0] = *texCoord;
  local_138[0] = texCoord[1];
  local_118[1] = texCoord[3];
  local_118[2] = texCoord[6];
  local_118[3] = texCoord[9];
  local_138[1] = texCoord[4];
  local_138[2] = texCoord[7];
  local_138[3] = texCoord[10];
  local_158[0] = texCoord[2];
  local_158[1] = texCoord[5];
  local_158[2] = texCoord[8];
  local_158[3] = texCoord[0xb];
  if (local_78.m_numLevels < 1) {
    local_1f4[2] = 0;
  }
  else {
    local_1f4[2] = ((local_78.m_levels)->m_size).m_data[2];
  }
  fVar23 = (float)(result->m_size).m_data[0];
  local_27c = (float)(result->m_size).m_data[1];
  local_178[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_178[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_178[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_178[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar14 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar14 = (sampleParams->super_RenderParams).bias;
  }
  lVar8 = 0;
  do {
    afStack_80[lVar8] = fVar14;
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  local_68 = (undefined1  [4])0xbf800000;
  fStack_64 = 0.0;
  pCStack_60 = (ConstPixelBufferAccess *)0x3f800000;
  local_58 = 0xbf80000000000000;
  uStack_50 = 0x3f80000000000000;
  local_198[0] = -1.7146522e+38;
  local_168 = local_178[2];
  local_164 = local_178[1];
  local_148 = local_158[2];
  local_144 = local_158[1];
  local_128 = local_138[2];
  local_124 = local_138[1];
  local_108 = local_118[2];
  local_104 = local_118[1];
  tcu::RGBA::toVec((RGBA *)&local_188);
  tcu::clear(local_100,&local_188);
  if ((result->m_size).m_data[1] < 1) {
    local_200 = 0;
  }
  else {
    local_200 = 0;
    z = 0;
    local_1e8 = sampleParams;
    local_a0 = result;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        local_228._16_4_ = (float)z + 0.5;
        local_1c4 = (float)local_228._16_4_ / local_27c;
        local_1d8 = ((float)local_228._16_4_ + -0.0625) / local_27c;
        local_1dc = ((float)local_228._16_4_ + 0.0625) / local_27c;
        local_1d0 = local_27c - (float)local_228._16_4_;
        local_1d4 = 1.0 - local_1c4;
        y = 0;
        local_258 = z;
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_228,(int)result,y,z)
          ;
          local_198[0] = 0.0;
          local_198[1] = 0.0;
          local_198[2] = 0.0;
          local_198[3] = 0.0;
          lVar8 = 0;
          do {
            local_198[lVar8] =
                 *(float *)(local_228 + lVar8 * 4) -
                 (local_1e8->super_RenderParams).colorBias.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_188.m_data[0] = 0.0;
          local_188.m_data[1] = 0.0;
          local_188.m_data[2] = 0.0;
          local_188.m_data[3] = 0.0;
          lVar8 = 0;
          do {
            local_188.m_data[lVar8] =
                 local_198[lVar8] / (local_1e8->super_RenderParams).colorScale.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_238,(int)local_98,y,z);
          local_228._0_4_ = R;
          local_228._4_4_ = SNORM_INT8;
          local_228._8_4_ = 0;
          local_228._12_4_ = 0;
          lVar8 = 0;
          do {
            *(float *)(local_228 + lVar8 * 4) =
                 *(float *)(local_238 + lVar8 * 4) -
                 (local_1e8->super_RenderParams).colorBias.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_198[0] = 0.0;
          local_198[1] = 0.0;
          local_198[2] = 0.0;
          local_198[3] = 0.0;
          lVar8 = 0;
          do {
            local_198[lVar8] =
                 *(float *)(local_228 + lVar8 * 4) /
                 (local_1e8->super_RenderParams).colorScale.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_238._0_4_ = R;
          local_238._4_4_ = SNORM_INT8;
          local_238._8_8_ = 0;
          lVar8 = 0;
          do {
            *(float *)(local_238 + lVar8 * 4) = local_188.m_data[lVar8] - local_198[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_228._0_4_ = R;
          local_228._4_4_ = SNORM_INT8;
          local_228._8_4_ = 0;
          local_228._12_4_ = 0;
          lVar8 = 0;
          do {
            fVar14 = *(float *)(local_238 + lVar8 * 4);
            fVar15 = -fVar14;
            if (-fVar14 <= fVar14) {
              fVar15 = fVar14;
            }
            *(float *)(local_228 + lVar8 * 4) = fVar15;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_278 = local_278 & 0xffffffff00000000;
          lVar8 = 0;
          do {
            *(bool *)((long)&local_278 + lVar8) =
                 *(float *)(local_228 + lVar8 * 4) <= (lookupPrec->colorThreshold).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          if ((char)local_278 == '\0') {
LAB_009ce7dc:
            local_250 = (float)y + 0.5;
            fVar14 = (local_250 + -0.0625) / fVar23 + local_1d8;
            fVar15 = (local_250 + 0.0625) / fVar23 + local_1dc;
            local_254 = y;
            if ((fVar14 <= 1.0) || (1.0 <= fVar15)) {
              local_1c0 = local_250 / fVar23;
              local_88 = (ulong)(1.0 <= fVar15);
              uVar12 = (ulong)(1.0 < fVar14);
              local_1c8 = fVar23 - local_250;
              local_1cc = 1.0 - local_1c0;
              bVar11 = false;
              do {
                local_228._20_4_ = local_250;
                fVar15 = local_1c4;
                fVar14 = local_1c0;
                if (uVar12 != 0) {
                  local_228._20_4_ = local_1c8;
                  fVar15 = local_1d4;
                  fVar14 = local_1cc;
                }
                fVar16 = local_118[uVar12 * 3];
                fVar17 = local_118[uVar12 * 3 + 1];
                fVar19 = (1.0 - fVar14) - fVar15;
                fVar18 = local_178[uVar12 * 3];
                local_228._28_4_ = local_178[uVar12 * 3 + 1];
                fVar1 = local_118[uVar12 * 3 + 2];
                local_228._24_4_ = local_178[uVar12 * 3 + 2];
                fVar21 = fVar14 / (float)local_228._24_4_ +
                         fVar15 / (float)local_228._28_4_ + fVar19 / fVar18;
                fVar2 = local_138[uVar12 * 3];
                fVar3 = local_138[uVar12 * 3 + 1];
                fVar4 = local_138[uVar12 * 3 + 2];
                fVar5 = local_158[uVar12 * 3];
                fVar6 = local_158[uVar12 * 3 + 1];
                local_1bc = local_158[uVar12 * 3 + 2];
                local_228._4_4_ =
                     ((fVar14 * fVar4) / (float)local_228._24_4_ +
                     (fVar15 * fVar3) / (float)local_228._28_4_ + (fVar19 * fVar2) / fVar18) /
                     fVar21;
                local_228._0_4_ =
                     ((fVar14 * fVar1) / (float)local_228._24_4_ +
                     (fVar15 * fVar17) / (float)local_228._28_4_ + (fVar19 * fVar16) / fVar18) /
                     fVar21;
                local_228._8_4_ =
                     ((fVar14 * local_1bc) / (float)local_228._24_4_ +
                     (fVar15 * fVar6) / (float)local_228._28_4_ + (fVar19 * fVar5) / fVar18) /
                     fVar21;
                local_19c = (float)local_228._24_4_ * fVar23;
                local_23c = (float)local_228._28_4_ * (float)local_228._24_4_;
                fVar20 = fVar15 + -1.0;
                fVar22 = (fVar23 * fVar20 + local_250) * local_23c -
                         (local_19c * fVar15 + local_250 * (float)local_228._28_4_) * fVar18;
                local_1a0 = (fVar17 - fVar16) * (float)local_228._24_4_ + (fVar1 - fVar17) * fVar18;
                local_1a4 = (fVar16 - fVar1) * (float)local_228._28_4_;
                local_1a8 = (fVar3 - fVar2) * (float)local_228._24_4_ + (fVar4 - fVar3) * fVar18;
                local_1ac = (fVar2 - fVar4) * (float)local_228._28_4_;
                local_1b0 = (fVar6 - fVar5) * (float)local_228._24_4_ + (local_1bc - fVar6) * fVar18
                ;
                local_1b4 = (fVar5 - local_1bc) * (float)local_228._28_4_;
                fVar19 = fVar18 * (float)local_228._28_4_ * (float)local_228._24_4_;
                local_c8 = ZEXT416((uint)fVar19);
                fVar21 = fVar19 * fVar23;
                fVar22 = fVar22 * fVar22;
                local_48 = ZEXT416((uint)fVar21);
                local_278 = CONCAT44(((local_1ac * fVar20 + fVar15 * local_1a8) * fVar21) / fVar22,
                                     ((local_1a4 * fVar20 + fVar15 * local_1a0) * fVar21) / fVar22);
                local_270 = ((fVar20 * local_1b4 + fVar15 * local_1b0) * fVar21) / fVar22;
                local_b8 = -fVar18;
                uStack_b4 = 0x80000000;
                uStack_b0 = 0x80000000;
                uStack_ac = 0x80000000;
                local_290[2] = 0.0;
                local_290[0] = 0.0;
                local_290[1] = 0.0;
                lVar8 = 0;
                do {
                  local_290[lVar8] = (float)local_1f4[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_238._8_8_ = local_238._8_8_ & 0xffffffff00000000;
                local_238._0_4_ = R;
                local_238._4_4_ = SNORM_INT8;
                lVar8 = 0;
                do {
                  *(float *)(local_238 + lVar8 * 4) =
                       *(float *)((long)&local_278 + lVar8 * 4) * local_290[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                fVar15 = fVar14 + -1.0;
                local_1b8 = (float)local_228._28_4_ * local_27c;
                fVar21 = (local_27c * fVar15 + (float)local_228._16_4_) * local_23c +
                         (local_1b8 * fVar14 + (float)local_228._16_4_ * (float)local_228._24_4_) *
                         -fVar18;
                local_248 = (fVar16 - fVar17) * (float)local_228._24_4_;
                local_280 = (fVar17 - fVar1) * fVar18 + (fVar1 - fVar16) * (float)local_228._28_4_;
                local_290[3] = (fVar2 - fVar3) * (float)local_228._24_4_;
                local_240 = (fVar3 - fVar4) * fVar18 + (fVar4 - fVar2) * (float)local_228._28_4_;
                local_244 = (fVar6 - local_1bc) * fVar18 +
                            (local_1bc - fVar5) * (float)local_228._28_4_;
                local_24c = (fVar5 - fVar6) * (float)local_228._24_4_;
                fVar19 = fVar19 * local_27c;
                fVar21 = fVar21 * fVar21;
                local_c8 = ZEXT416((uint)fVar19);
                local_290[1] = ((local_290[3] * fVar15 + fVar14 * local_240) * fVar19) / fVar21;
                local_290[0] = ((local_248 * fVar15 + fVar14 * local_280) * fVar19) / fVar21;
                local_290[2] = ((fVar15 * local_24c + fVar14 * local_244) * fVar19) / fVar21;
                local_298 = 0.0;
                local_2a0.m_data[0] = 0.0;
                local_2a0.m_data[1] = 0.0;
                lVar8 = 0;
                do {
                  local_2a0.m_data[lVar8] = (float)local_1f4[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_270 = 0.0;
                local_278 = 0;
                lVar8 = 0;
                do {
                  *(float *)((long)&local_278 + lVar8 * 4) =
                       local_290[lVar8] * local_2a0.m_data[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                local_2a8 = (float)local_228._16_4_;
                if (uVar12 != 0) {
                  local_2a8 = local_1d0;
                }
                tcu::computeLodBoundsFromDerivates
                          ((tcu *)local_208,(float)local_238._0_4_,(float)local_238._4_4_,
                           (float)local_238._8_4_,(float)local_278,local_278._4_4_,local_270,lodPrec
                          );
                lVar8 = 0;
                do {
                  fVar14 = *(float *)(local_68 + lVar8 * 8) + (float)local_228._20_4_;
                  fVar15 = *(float *)(local_68 + lVar8 * 8 + 4) + local_2a8;
                  fVar18 = fVar15 / local_27c;
                  fVar16 = fVar18 + -1.0;
                  fVar17 = (fVar23 * fVar16 + fVar14) * local_23c +
                           (local_19c * fVar18 + (float)local_228._28_4_ * fVar14) * local_b8;
                  fVar17 = fVar17 * fVar17;
                  local_2a0.m_data[1] =
                       ((local_1ac * fVar16 + local_1a8 * fVar18) * (float)local_48._0_4_) / fVar17;
                  local_2a0.m_data[0] =
                       ((local_1a4 * fVar16 + local_1a0 * fVar18) * (float)local_48._0_4_) / fVar17;
                  local_298 = ((fVar16 * local_1b4 + fVar18 * local_1b0) * (float)local_48._0_4_) /
                              fVar17;
                  local_260 = 0.0;
                  local_268 = 0;
                  lVar9 = 0;
                  do {
                    *(float *)((long)&local_268 + lVar9 * 4) = (float)local_1f4[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_290[2] = 0.0;
                  local_290[0] = 0.0;
                  local_290[1] = 0.0;
                  lVar9 = 0;
                  do {
                    local_290[lVar9] =
                         local_2a0.m_data[lVar9] * *(float *)((long)&local_268 + lVar9 * 4);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  fVar14 = fVar14 / fVar23;
                  fVar16 = fVar14 + -1.0;
                  fVar15 = (local_27c * fVar16 + fVar15) * local_23c +
                           (local_1b8 * fVar14 + fVar15 * (float)local_228._24_4_) * local_b8;
                  fVar15 = fVar15 * fVar15;
                  local_268._0_4_ =
                       ((local_248 * fVar16 + local_280 * fVar14) * (float)local_c8._0_4_) / fVar15;
                  local_268._4_4_ =
                       ((local_290[3] * fVar16 + local_240 * fVar14) * (float)local_c8._0_4_) /
                       fVar15;
                  local_260 = ((fVar16 * local_24c + fVar14 * local_244) * (float)local_c8._0_4_) /
                              fVar15;
                  local_f8[2] = 0.0;
                  local_f8[0] = 0.0;
                  local_f8[1] = 0.0;
                  lVar9 = 0;
                  do {
                    local_f8[lVar9] = (float)local_1f4[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  local_298 = 0.0;
                  local_2a0.m_data[0] = 0.0;
                  local_2a0.m_data[1] = 0.0;
                  lVar9 = 0;
                  do {
                    local_2a0.m_data[lVar9] =
                         *(float *)((long)&local_268 + lVar9 * 4) * local_f8[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  tcu::computeLodBoundsFromDerivates
                            ((tcu *)&local_268,local_290[0],local_290[1],local_290[2],
                             local_2a0.m_data[0],local_2a0.m_data[1],local_298,lodPrec);
                  local_208[0] = (float)(~-(uint)(local_208[0] <= (float)local_268) &
                                         (uint)(float)local_268 |
                                        (uint)local_208[0] &
                                        -(uint)(local_208[0] <= (float)local_268));
                  local_208[1] = (float)(~-(uint)(local_268._4_4_ <= local_208[1]) &
                                         (uint)local_268._4_4_ |
                                        (uint)local_208[1] &
                                        -(uint)(local_268._4_4_ <= local_208[1]));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                local_2a0.m_data[0] = 0.0;
                local_2a0.m_data[1] = 0.0;
                lVar8 = 0;
                do {
                  local_2a0.m_data[lVar8] = local_208[lVar8] + afStack_80[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 == 1);
                local_268._0_4_ = local_1e8->minLod;
                local_268._4_4_ = local_1e8->maxLod;
                tcu::clampLodBounds((tcu *)local_290,&local_2a0,(Vec2 *)&local_268,lodPrec);
                bVar7 = tcu::isLookupResultValid
                                  (&local_78,local_90,lookupPrec,(Vec3 *)local_228,(Vec2 *)local_290
                                   ,&local_188);
                if (bVar7) {
                  bVar11 = true;
                }
                bVar13 = uVar12 < local_88;
                uVar12 = uVar12 + 1;
              } while (bVar13 && !bVar7);
              result = local_a0;
              z = local_258;
              y = local_254;
              if (bVar11) goto LAB_009cf36b;
            }
            local_238._0_4_ = 0xff0000ff;
            tcu::RGBA::toVec((RGBA *)local_228);
            tcu::PixelBufferAccess::setPixel(local_100,(Vec4 *)local_228,local_254,local_258,0);
            local_200 = (ulong)((int)local_200 + 1);
            z = local_258;
            y = local_254;
          }
          else {
            uVar12 = 0;
            do {
              uVar10 = uVar12;
              if (uVar10 == 3) break;
              uVar12 = uVar10 + 1;
            } while (*(char *)((long)&local_278 + uVar10 + 1) != '\0');
            if (uVar10 < 3) goto LAB_009ce7dc;
          }
LAB_009cf36b:
          y = y + 1;
        } while (y < (result->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (result->m_size).m_data[1]);
  }
  if (local_e8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_200;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture3DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture3DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec3							srcSize				= tcu::IVec3(src.getWidth(), src.getHeight(), src.getDepth());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
					const tcu::Vec3	coordDy		= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

					tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDx.z(), coordDy.x(), coordDy.y(), coordDy.z(), lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordDxo	= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
						const tcu::Vec3	coordDyo	= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
						const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDxo.z(), coordDyo.x(), coordDyo.y(), coordDyo.z(), lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}